

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connected_proxy(connectdata *conn,int sockindex)

{
  _Bool _Var1;
  char *hostname;
  CURLcode CVar2;
  long lVar3;
  uint remote_port;
  
  CVar2 = CURLE_OK;
  if ((conn->bits).socksproxy == true) {
    _Var1 = (conn->bits).httpproxy;
    lVar3 = 0x160;
    if (((_Var1 == false) && (lVar3 = 0x100, (conn->bits).conn_to_host == false)) &&
       (lVar3 = 0xd0, sockindex == 1)) {
      lVar3 = 0xe8;
    }
    if (_Var1 == false) {
      if (sockindex == 1) {
        remote_port = (uint)conn->secondary_port;
      }
      else if ((conn->bits).conn_to_port == true) {
        remote_port = conn->conn_to_port;
      }
      else {
        remote_port = conn->remote_port;
      }
    }
    else {
      remote_port = (uint)(conn->http_proxy).port;
    }
    hostname = *(char **)((conn->chunk).hexbuffer + lVar3 + -0x20);
    (conn->bits).socksproxy_connecting = true;
    switch((conn->socks_proxy).proxytype) {
    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      CVar2 = Curl_SOCKS4((conn->socks_proxy).user,hostname,remote_port,sockindex,conn);
      break;
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      CVar2 = Curl_SOCKS5((conn->socks_proxy).user,(conn->socks_proxy).passwd,hostname,remote_port,
                          sockindex,conn);
      break;
    default:
      Curl_failf(conn->data,"unknown proxytype option given");
      CVar2 = CURLE_COULDNT_CONNECT;
    }
    (conn->bits).socksproxy_connecting = false;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_connected_proxy(struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.socksproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host = conn->bits.httpproxy ?
                              conn->http_proxy.host.name :
                              conn->bits.conn_to_host ?
                              conn->conn_to_host.name :
                              sockindex == SECONDARYSOCKET ?
                              conn->secondaryhostname : conn->host.name;
    const int port = conn->bits.httpproxy ? (int)conn->http_proxy.port :
                     sockindex == SECONDARYSOCKET ? conn->secondary_port :
                     conn->bits.conn_to_port ? conn->conn_to_port :
                     conn->remote_port;
    conn->bits.socksproxy_connecting = TRUE;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      result = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                         host, port, sockindex, conn);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      result = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                           conn);
      break;

    default:
      failf(conn->data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    conn->bits.socksproxy_connecting = FALSE;
#else
  (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
  }

  return result;
}